

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_index.c
# Opt level: O2

int cram_index_build(cram_fd *fd,char *fn_base)

{
  int iVar1;
  hFILE *phVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  cram_block_slice_hdr *pcVar7;
  int iVar8;
  size_t sVar9;
  zfp *zf;
  cram_container *c;
  cram_block *b;
  cram_block_compression_hdr *pcVar10;
  cram_slice *s;
  ulong uVar11;
  cram_record *pcVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  char *local_1860;
  char local_1838 [1024];
  char buf [1024];
  char fn_idx [4096];
  
  sVar9 = strlen(fn_base);
  uVar18 = 0xffffffff;
  if (sVar9 < 0xffb) {
    sprintf(fn_idx,"%s.crai",fn_base);
    zf = zfopen(fn_idx,"wz");
    if (zf == (zfp *)0x0) {
      perror(fn_idx);
    }
    else {
      phVar2 = fd->fp;
      local_1860 = phVar2->begin + (phVar2->offset - (long)phVar2->buffer);
      while( true ) {
        c = cram_read_container(fd);
        iVar8 = fd->err;
        if (c == (cram_container *)0x0) break;
        if (iVar8 != 0) {
          perror("Cram container read");
          return 1;
        }
        phVar2 = fd->fp;
        lVar3 = phVar2->offset;
        pcVar4 = phVar2->begin;
        pcVar5 = phVar2->buffer;
        b = cram_read_block(fd);
        c->comp_hdr_block = b;
        if (b == (cram_block *)0x0) {
          return 1;
        }
        if (b->content_type != COMPRESSION_HEADER) {
          __assert_fail("c->comp_hdr_block->content_type == COMPRESSION_HEADER",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_index.c"
                        ,0x1fd,"int cram_index_build(cram_fd *, const char *)");
        }
        pcVar10 = cram_decode_compression_header(fd,b);
        c->comp_hdr = pcVar10;
        if (pcVar10 == (cram_block_compression_hdr *)0x0) {
          return -1;
        }
        for (lVar16 = 0; lVar16 < c->num_landmarks; lVar16 = lVar16 + 1) {
          phVar2 = fd->fp;
          lVar19 = phVar2->offset;
          pcVar15 = phVar2->begin;
          pcVar6 = phVar2->buffer;
          if ((long)(pcVar15 + (lVar19 - (long)pcVar6)) - (long)(local_1860 + c->offset) !=
              (long)c->landmark[lVar16]) {
            __assert_fail("spos - cpos - c->offset == c->landmark[j]",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_index.c"
                          ,0x20a,"int cram_index_build(cram_fd *, const char *)");
          }
          s = cram_read_slice(fd);
          if (s == (cram_slice *)0x0) {
            zfclose(zf);
            return -1;
          }
          phVar2 = fd->fp;
          uVar21 = (ulong)(uint)(((int)phVar2->offset + *(int *)&phVar2->begin) -
                                ((int)(pcVar15 + (lVar19 - (long)pcVar6)) + *(int *)&phVar2->buffer)
                                );
          pcVar7 = s->hdr;
          uVar14 = (ulong)(uint)pcVar7->ref_seq_id;
          if (pcVar7->ref_seq_id == 0xfffffffe) {
            uVar11 = (ulong)(uint)c->landmark[lVar16];
            iVar8 = cram_decode_slice(fd,c,s,fd->header);
            if (iVar8 == 0) {
              iVar8 = -0x80000000;
              lVar20 = 0;
              lVar19 = 0;
              uVar14 = 0xfffffffffffffffe;
              uVar13 = 0;
              while( true ) {
                uVar18 = (uint)uVar14;
                if (s->hdr->num_records <= lVar19) break;
                pcVar12 = s->crecs;
                uVar17 = *(uint *)((long)&pcVar12->ref_id + lVar20);
                if (uVar17 == uVar18) {
                  iVar1 = *(int *)((long)&pcVar12->aend + lVar20);
                  if (iVar8 <= iVar1) {
                    iVar8 = iVar1;
                  }
                }
                else {
                  if (uVar18 != 0xfffffffe) {
                    sprintf(local_1838,"%d\t%d\t%d\t%ld\t%d\t%d\n",uVar14,uVar13,
                            (ulong)((iVar8 - (int)uVar13) + 1),local_1860,uVar11,uVar21);
                    zfputs(local_1838,zf);
                    pcVar12 = s->crecs;
                    uVar17 = *(uint *)((long)&pcVar12->ref_id + lVar20);
                  }
                  uVar13 = (ulong)*(uint *)((long)&pcVar12->apos + lVar20);
                  uVar14 = (ulong)uVar17;
                  iVar8 = -0x80000000;
                }
                lVar19 = lVar19 + 1;
                lVar20 = lVar20 + 0x70;
              }
              if (uVar18 != 0xfffffffe) {
                uVar18 = (iVar8 - (int)uVar13) + 1;
                pcVar15 = local_1838;
                goto LAB_00141533;
              }
            }
          }
          else {
            uVar13 = (ulong)(uint)pcVar7->ref_seq_start;
            uVar18 = pcVar7->ref_seq_span;
            uVar11 = (ulong)(uint)c->landmark[lVar16];
            pcVar15 = buf;
LAB_00141533:
            sprintf(pcVar15,"%d\t%d\t%d\t%ld\t%d\t%d\n",uVar14,uVar13,(ulong)uVar18,local_1860,
                    uVar11,uVar21);
            zfputs(pcVar15,zf);
          }
          cram_free_slice(s);
        }
        phVar2 = fd->fp;
        local_1860 = phVar2->begin + (phVar2->offset - (long)phVar2->buffer);
        if (local_1860 != pcVar4 + (long)c->length + (lVar3 - (long)pcVar5)) {
          __assert_fail("cpos == hpos + c->length",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_index.c"
                        ,0x222,"int cram_index_build(cram_fd *, const char *)");
        }
        cram_free_container(c);
      }
      uVar18 = zfclose(zf);
      uVar18 = -(uint)(iVar8 != 0) | uVar18;
    }
  }
  return uVar18;
}

Assistant:

int cram_index_build(cram_fd *fd, const char *fn_base) {
    cram_container *c;
    off_t cpos, spos, hpos;
    zfp *fp;
    char fn_idx[PATH_MAX];

    if (strlen(fn_base) > PATH_MAX-6)
	return -1;

    sprintf(fn_idx, "%s.crai", fn_base);
    if (!(fp = zfopen(fn_idx, "wz"))) {
        perror(fn_idx);
        return -1;
    }

    cpos = htell(fd->fp);
    while ((c = cram_read_container(fd))) {
        int j;

        if (fd->err) {
            perror("Cram container read");
            return 1;
        }

        hpos = htell(fd->fp);

        if (!(c->comp_hdr_block = cram_read_block(fd)))
            return 1;
        assert(c->comp_hdr_block->content_type == COMPRESSION_HEADER);

        c->comp_hdr = cram_decode_compression_header(fd, c->comp_hdr_block);
        if (!c->comp_hdr)
            return -1;

        // 2.0 format
        for (j = 0; j < c->num_landmarks; j++) {
            char buf[1024];
            cram_slice *s;
            int sz;

            spos = htell(fd->fp);
            assert(spos - cpos - c->offset == c->landmark[j]);

            if (!(s = cram_read_slice(fd))) {
		zfclose(fp);
		return -1;
	    }

            sz = (int)(htell(fd->fp) - spos);

	    if (s->hdr->ref_seq_id == -2) {
		cram_index_build_multiref(fd, c, s, fp,
					  cpos, c->landmark[j], sz);
	    } else {
		sprintf(buf, "%d\t%d\t%d\t%"PRId64"\t%d\t%d\n",
			s->hdr->ref_seq_id, s->hdr->ref_seq_start,
			s->hdr->ref_seq_span, (int64_t)cpos,
			c->landmark[j], sz);
		zfputs(buf, fp);
	    }

            cram_free_slice(s);
        }

        cpos = htell(fd->fp);
        assert(cpos == hpos + c->length);

        cram_free_container(c);
    }
    if (fd->err) {
	zfclose(fp);
	return -1;
    }
	

    return zfclose(fp);
}